

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O0

CordRepBtree * absl::cord_internal::CordRepBtree::AppendSlow(CordRepBtree *tree,CordRep *rep)

{
  anon_class_8_1_8992209c this;
  CordRep *left;
  bool bVar1;
  CordRepBtree *right;
  Invoker<void,_absl::cord_internal::CordRep_*,_unsigned_long,_unsigned_long> in_RCX;
  FunctionRef<void_(absl::cord_internal::CordRep_*,_unsigned_long,_unsigned_long)> consume_fn;
  CordRep *local_38;
  VoidPtr local_30;
  anon_class_8_1_8992209c local_28;
  anon_class_8_1_8992209c consume;
  CordRep *rep_local;
  CordRepBtree *tree_local;
  
  consume.tree = (CordRepBtree **)rep;
  rep_local = &tree->super_CordRep;
  bVar1 = CordRep::IsBtree(rep);
  left = rep_local;
  this.tree = consume.tree;
  if (bVar1) {
    right = CordRep::btree((CordRep *)consume.tree);
    tree_local = MergeTrees((CordRepBtree *)left,right);
  }
  else {
    local_28.tree = (CordRepBtree **)&rep_local;
    FunctionRef<void(absl::cord_internal::CordRep*,unsigned_long,unsigned_long)>::
    FunctionRef<absl::cord_internal::CordRepBtree::AppendSlow(absl::cord_internal::CordRepBtree*,absl::cord_internal::CordRep*)::__0,void>
              ((FunctionRef<void(absl::cord_internal::CordRep*,unsigned_long,unsigned_long)> *)
               &local_38,&local_28);
    consume_fn.invoker_ = in_RCX;
    consume_fn.ptr_.obj = local_30.obj;
    Consume((cord_internal *)this.tree,local_38,consume_fn);
    tree_local = (CordRepBtree *)rep_local;
  }
  return tree_local;
}

Assistant:

CordRepBtree* CordRepBtree::AppendSlow(CordRepBtree* tree, CordRep* rep) {
  if (ABSL_PREDICT_TRUE(rep->IsBtree())) {
    return MergeTrees(tree, rep->btree());
  }
  auto consume = [&tree](CordRep* r, size_t offset, size_t length) {
    r = MakeSubstring(r, offset, length);
    tree = CordRepBtree::AddCordRep<kBack>(tree, r);
  };
  Consume(rep, consume);
  return tree;
}